

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v3_skey.cc
# Opt level: O0

void * s2i_skey_id(X509V3_EXT_METHOD *method,X509V3_CTX *ctx,char *str)

{
  void *data;
  int iVar1;
  EVP_MD *type;
  uint local_7c;
  uchar local_78 [4];
  uint diglen;
  uchar pkey_dig [64];
  ASN1_BIT_STRING *pk;
  ASN1_OCTET_STRING *oct;
  char *str_local;
  X509V3_CTX *ctx_local;
  X509V3_EXT_METHOD *method_local;
  
  iVar1 = strcmp(str,"hash");
  if (iVar1 == 0) {
    method_local = (X509V3_EXT_METHOD *)ASN1_OCTET_STRING_new();
    if (method_local == (X509V3_EXT_METHOD *)0x0) {
      method_local = (X509V3_EXT_METHOD *)0x0;
    }
    else if ((ctx == (X509V3_CTX *)0x0) || (ctx->flags != 1)) {
      if ((ctx == (X509V3_CTX *)0x0) ||
         ((ctx->subject_req == (X509_REQ *)0x0 && (ctx->subject_cert == (X509 *)0x0)))) {
        ERR_put_error(0x14,0,0x90,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/v3_skey.cc"
                      ,0x56);
      }
      else {
        if (ctx->subject_req == (X509_REQ *)0x0) {
          pkey_dig._56_8_ = ctx->subject_cert->cert_info->key->public_key;
        }
        else {
          pkey_dig._56_8_ = ctx->subject_req->req_info->pubkey->public_key;
        }
        if (pkey_dig._56_8_ == 0) {
          ERR_put_error(0x14,0,0x90,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/v3_skey.cc"
                        ,0x61);
        }
        else {
          data = *(void **)(pkey_dig._56_8_ + 8);
          iVar1 = *(int *)pkey_dig._56_8_;
          type = EVP_sha1();
          iVar1 = EVP_Digest(data,(long)iVar1,local_78,&local_7c,type,(ENGINE *)0x0);
          if ((iVar1 != 0) &&
             (iVar1 = ASN1_OCTET_STRING_set((ASN1_OCTET_STRING *)method_local,local_78,local_7c),
             iVar1 != 0)) {
            return method_local;
          }
        }
      }
      ASN1_OCTET_STRING_free((ASN1_OCTET_STRING *)method_local);
      method_local = (X509V3_EXT_METHOD *)0x0;
    }
  }
  else {
    method_local = (X509V3_EXT_METHOD *)
                   s2i_ASN1_OCTET_STRING((X509V3_EXT_METHOD *)method,(X509V3_CTX *)ctx,str);
  }
  return method_local;
}

Assistant:

static void *s2i_skey_id(const X509V3_EXT_METHOD *method, const X509V3_CTX *ctx,
                         const char *str) {
  ASN1_OCTET_STRING *oct;
  ASN1_BIT_STRING *pk;
  unsigned char pkey_dig[EVP_MAX_MD_SIZE];
  unsigned int diglen;

  if (strcmp(str, "hash")) {
    return s2i_ASN1_OCTET_STRING(method, ctx, str);
  }

  if (!(oct = ASN1_OCTET_STRING_new())) {
    return NULL;
  }

  if (ctx && (ctx->flags == X509V3_CTX_TEST)) {
    return oct;
  }

  if (!ctx || (!ctx->subject_req && !ctx->subject_cert)) {
    OPENSSL_PUT_ERROR(X509V3, X509V3_R_NO_PUBLIC_KEY);
    goto err;
  }

  if (ctx->subject_req) {
    pk = ctx->subject_req->req_info->pubkey->public_key;
  } else {
    pk = ctx->subject_cert->cert_info->key->public_key;
  }

  if (!pk) {
    OPENSSL_PUT_ERROR(X509V3, X509V3_R_NO_PUBLIC_KEY);
    goto err;
  }

  if (!EVP_Digest(pk->data, pk->length, pkey_dig, &diglen, EVP_sha1(), NULL)) {
    goto err;
  }

  if (!ASN1_OCTET_STRING_set(oct, pkey_dig, diglen)) {
    goto err;
  }

  return oct;

err:
  ASN1_OCTET_STRING_free(oct);
  return NULL;
}